

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall Js::LocalsWalker::Get(LocalsWalker *this,int i,ResolvedObject *pResolvedObject)

{
  Type pVVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  Type *ppVVar9;
  undefined4 *puVar10;
  uint uVar11;
  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  uint uVar12;
  int iVar13;
  uint local_38;
  uint local_34;
  
  if (i < (int)this->totalLocalsCount) {
    local_38 = i;
    iVar4 = (*this->pFrame->_vptr_DiagStackFrame[10])();
    pResolvedObject->scriptContext = (ScriptContext *)CONCAT44(extraout_var,iVar4);
    BVar5 = VariableWalkerBase::GetExceptionObject((int *)&local_38,this->pFrame,pResolvedObject);
    iVar4 = 1;
    if (BVar5 != 0) {
      return 1;
    }
    BVar5 = VariableWalkerBase::GetReturnedValue((int *)&local_38,this->pFrame,pResolvedObject);
    if (BVar5 != 0) {
      return 1;
    }
    if (this->hasUserNotDefinedArguments == true) {
      if (local_38 == 0) {
        CreateArgumentsObject(this,pResolvedObject);
        return 1;
      }
      local_38 = local_38 - 1;
    }
    if ((this->pVarWalkers !=
         (List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)0x0) &&
       ((this->pVarWalkers->
        super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).count
        != 0)) {
      this_00 = this->pVarWalkers;
      iVar13 = (this_00->
               super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
               ).count;
      if ((this->frameWalkerFlags & 1) != 0) {
        if (iVar13 < 1) {
          bVar3 = true;
          iVar13 = 0;
        }
        else {
          iVar6 = 0;
          iVar13 = 0;
          uVar11 = local_38;
          do {
            local_34 = uVar11;
            ppVVar9 = JsUtil::
                      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(this_00,iVar6);
            pVVar1 = *ppVVar9;
            iVar8 = 7;
            bVar3 = false;
            uVar11 = local_34;
            if ((pVVar1->groupType < (UIGroupType_Param|UIGroupType_InnerScope)) &&
               ((0x13U >> (pVVar1->groupType & 0x1f) & 1) != 0)) {
              iVar7 = (*(pVVar1->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase
                        [1])(pVVar1);
              if ((int)local_34 < iVar7) {
                iVar4 = (**(pVVar1->super_IDiagObjectModelWalkerBase).
                           _vptr_IDiagObjectModelWalkerBase)(pVVar1,(ulong)local_34,pResolvedObject)
                ;
                iVar8 = 1;
                bVar3 = false;
                uVar11 = local_34;
              }
              else {
                iVar13 = iVar13 + 1;
                iVar8 = 0;
                bVar3 = true;
                uVar11 = local_34 - iVar7;
              }
            }
            if (!bVar3) goto LAB_008c0678;
            iVar6 = iVar6 + 1;
            this_00 = this->pVarWalkers;
          } while (iVar6 < (this_00->
                           super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                           ).count);
          iVar8 = 7;
LAB_008c0678:
          bVar3 = iVar8 == 7;
          local_38 = uVar11;
        }
        if (!bVar3) {
          return iVar4;
        }
        iVar13 = iVar13 + local_38;
        if ((this->pVarWalkers->
            super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count <= iVar13) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                      ,0x526,"((i + startScopeIndex) < pVarWalkers->Count())",
                                      "(i + startScopeIndex) < pVarWalkers->Count()");
          if (!bVar3) goto LAB_008c0786;
          *puVar10 = 0;
        }
        ppVVar9 = JsUtil::
                  List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->pVarWalkers,iVar13);
        BVar5 = VariableWalkerBase::GetGroupObject(*ppVVar9,pResolvedObject);
        return BVar5;
      }
      local_34 = CONCAT31(local_34._1_3_,0 < iVar13);
      uVar11 = local_38;
      if (0 < iVar13) {
        iVar13 = 0;
        uVar12 = local_38;
        do {
          ppVVar9 = JsUtil::
                    List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                    ::Item(this_00,iVar13);
          iVar6 = (*((*ppVVar9)->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase
                    [1])();
          uVar11 = uVar12 - iVar6;
          if ((int)uVar12 < iVar6) {
            ppVVar9 = JsUtil::
                      List<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item(this->pVarWalkers,iVar13);
            iVar4 = (**((*ppVVar9)->super_IDiagObjectModelWalkerBase).
                       _vptr_IDiagObjectModelWalkerBase)(*ppVVar9,(ulong)uVar12,pResolvedObject);
            uVar11 = uVar12;
            break;
          }
          iVar13 = iVar13 + 1;
          this_00 = this->pVarWalkers;
          iVar6 = (this_00->
                  super_ReadOnlyList<Js::VariableWalkerBase_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          local_34 = CONCAT31(local_34._1_3_,iVar13 < iVar6);
          uVar12 = uVar11;
        } while (iVar13 < iVar6);
      }
      if ((local_34 & 1) != 0) {
        return iVar4;
      }
      AssertCount = AssertCount + 1;
      local_38 = uVar11;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0x4ff,"(0)","FALSE");
      if (!bVar3) {
LAB_008c0786:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
    }
  }
  return 0;
}

Assistant:

BOOL LocalsWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        if (i >= (int)totalLocalsCount)
        {
            return FALSE;
        }

        pResolvedObject->scriptContext = pFrame->GetScriptContext();

        if (VariableWalkerBase::GetExceptionObject(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Pending mutation display should be before any return value
        if (VariableWalkerBase::GetBreakMutationBreakpointValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }
#endif

        if (VariableWalkerBase::GetReturnedValue(i, pFrame, pResolvedObject))
        {
            return TRUE;
        }

        if (hasUserNotDefinedArguments)
        {
            if (i == 0)
            {
                return CreateArgumentsObject(pResolvedObject);
            }
            i--;
        }

        if (!pVarWalkers || pVarWalkers->Count() == 0)
        {
            return FALSE;
        }

        // In the case of not making groups, all variables will be arranged
        // as one int32 list in the locals window.
        if (!ShouldMakeGroups())
        {
            for (int j = 0; j < pVarWalkers->Count(); j++)
            {
                int count = pVarWalkers->Item(j)->GetChildrenCount();
                if (i < count)
                {
                    return pVarWalkers->Item(j)->Get(i, pResolvedObject);
                }
                i-= count;
            }

            Assert(FALSE);
            return FALSE;
        }

        int startScopeIndex = 0;

        // Need to determine what range of local variables we're in for the requested index.
        // Non-grouped local variables are organized with reg slot coming first, then followed by
        // scope slot/activation object variables. Catch and with variables follow next
        // and group variables are stored last which come from upper scopes that
        // are accessed in this function (those passed down as part of a closure).
        // Note that all/any/none of these walkers may be present.
        // Example variable layout:
        // [0-2] - Reg slot vars.
        // [3-4] - Scope slot array vars.
        // [5-8] - Global vars (stored on the global object as properties).
        for (int j = 0; j < pVarWalkers->Count(); ++j)
        {
            VariableWalkerBase *variableWalker = pVarWalkers->Item(j);
            if (!variableWalker->IsInGroup())
            {
                int count = variableWalker->GetChildrenCount();

                if (i < count)
                {
                    return variableWalker->Get(i, pResolvedObject);
                }
                i-= count;
                startScopeIndex++;
            }
            else
            {
                // We've finished with all walkers for the current locals level so
                // break out in order to handle the groups.
                break;
            }
        }

        // Handle groups.
        Assert((i + startScopeIndex) < pVarWalkers->Count());
        VariableWalkerBase *variableWalker = pVarWalkers->Item(i + startScopeIndex);
        return variableWalker->GetGroupObject(pResolvedObject);
    }